

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,void **key)

{
  bool bVar1;
  int local_24;
  int local_20;
  int i;
  int last;
  uint targetBucket;
  
  bVar1 = BaseDictionary<void*,void*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<void*>
                    ((BaseDictionary<void*,void*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this,key,&local_24,&local_20,(uint *)&i);
  if (bVar1) {
    RemoveAt(this,local_24,local_20,i);
  }
  return bVar1;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }